

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O0

int aes_decrypt_key192(uchar *key,aes_decrypt_ctx *cx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t ss [7];
  aes_decrypt_ctx *cx_local;
  uchar *key_local;
  
  uVar11 = (uint)key[3] << 0x18 | (uint)key[2] << 0x10 | (uint)key[1] << 8 | (uint)*key;
  cx->ks[0x30] = uVar11;
  uVar12 = (uint)key[7] << 0x18 | (uint)key[6] << 0x10 | (uint)key[5] << 8 | (uint)key[4];
  cx->ks[0x31] = uVar12;
  uVar13 = (uint)key[0xb] << 0x18 | (uint)key[10] << 0x10 | (uint)key[9] << 8 | (uint)key[8];
  cx->ks[0x32] = uVar13;
  uVar14 = (uint)key[0xf] << 0x18 | (uint)key[0xe] << 0x10 | (uint)key[0xd] << 8 | (uint)key[0xc];
  cx->ks[0x33] = uVar14;
  bVar1 = key[0x13];
  bVar2 = key[0x12];
  bVar3 = key[0x11];
  bVar4 = key[0x10];
  cx->ks[0x2c] = t_im[0][key[0x10]] ^ t_im[1][key[0x11]] ^ t_im[2][key[0x12]] ^ t_im[3][(uint)bVar1]
  ;
  uVar10 = (uint)key[0x17];
  bVar5 = key[0x16];
  bVar6 = key[0x15];
  bVar7 = key[0x14];
  cx->ks[0x2d] = t_im[0][key[0x14]] ^ t_im[1][key[0x15]] ^ t_im[2][key[0x16]] ^ t_im[3][uVar10];
  uVar11 = t_fl[0][(uint)bVar6] ^ t_fl[1][(uint)bVar5] ^ t_fl[2][uVar10] ^ t_fl[3][(uint)bVar7] ^ 1
           ^ uVar11;
  cx->ks[0x2e] = t_im[0][uVar11 & 0xff] ^ t_im[1][uVar11 >> 8 & 0xff] ^
                 t_im[2][uVar11 >> 0x10 & 0xff] ^ t_im[3][uVar11 >> 0x18];
  uVar12 = uVar11 ^ uVar12;
  cx->ks[0x2f] = t_im[0][uVar12 & 0xff] ^ t_im[1][uVar12 >> 8 & 0xff] ^
                 t_im[2][uVar12 >> 0x10 & 0xff] ^ t_im[3][uVar12 >> 0x18];
  uVar13 = uVar12 ^ uVar13;
  cx->ks[0x28] = t_im[0][uVar13 & 0xff] ^ t_im[1][uVar13 >> 8 & 0xff] ^
                 t_im[2][uVar13 >> 0x10 & 0xff] ^ t_im[3][uVar13 >> 0x18];
  uVar14 = uVar13 ^ uVar14;
  cx->ks[0x29] = t_im[0][uVar14 & 0xff] ^ t_im[1][uVar14 >> 8 & 0xff] ^
                 t_im[2][uVar14 >> 0x10 & 0xff] ^ t_im[3][uVar14 >> 0x18];
  uVar8 = uVar14 ^ ((uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4);
  cx->ks[0x2a] = t_im[0][uVar8 & 0xff] ^ t_im[1][uVar8 >> 8 & 0xff] ^ t_im[2][uVar8 >> 0x10 & 0xff]
                 ^ t_im[3][uVar8 >> 0x18];
  uVar9 = uVar8 ^ (uVar10 << 0x18 | (uint)bVar5 << 0x10 | (uint)bVar6 << 8 | (uint)bVar7);
  cx->ks[0x2b] = t_im[0][uVar9 & 0xff] ^ t_im[1][uVar9 >> 8 & 0xff] ^ t_im[2][uVar9 >> 0x10 & 0xff]
                 ^ t_im[3][uVar9 >> 0x18];
  uVar10 = t_fl[0][uVar9 >> 8 & 0xff] ^ t_fl[1][uVar9 >> 0x10 & 0xff] ^ t_fl[2][uVar9 >> 0x18] ^
           t_fl[3][uVar9 & 0xff];
  uVar11 = uVar10 ^ 2 ^ uVar11;
  uVar10 = cx->ks[0x2e] ^
           t_im[0][(uVar10 ^ 2) & 0xff] ^ t_im[1][uVar10 >> 8 & 0xff] ^
           t_im[2][uVar10 >> 0x10 & 0xff] ^ t_im[3][uVar10 >> 0x18];
  cx->ks[0x24] = uVar10;
  uVar12 = uVar11 ^ uVar12;
  uVar10 = cx->ks[0x2f] ^ uVar10;
  cx->ks[0x25] = uVar10;
  uVar13 = uVar12 ^ uVar13;
  uVar10 = cx->ks[0x28] ^ uVar10;
  cx->ks[0x26] = uVar10;
  uVar14 = uVar13 ^ uVar14;
  uVar10 = cx->ks[0x29] ^ uVar10;
  cx->ks[0x27] = uVar10;
  uVar8 = uVar14 ^ uVar8;
  uVar10 = cx->ks[0x2a] ^ uVar10;
  cx->ks[0x20] = uVar10;
  uVar9 = uVar8 ^ uVar9;
  cx->ks[0x21] = cx->ks[0x2b] ^ uVar10;
  uVar10 = t_fl[0][uVar9 >> 8 & 0xff] ^ t_fl[1][uVar9 >> 0x10 & 0xff] ^ t_fl[2][uVar9 >> 0x18] ^
           t_fl[3][uVar9 & 0xff];
  uVar11 = uVar10 ^ 4 ^ uVar11;
  uVar10 = cx->ks[0x24] ^
           t_im[0][(uVar10 ^ 4) & 0xff] ^ t_im[1][uVar10 >> 8 & 0xff] ^
           t_im[2][uVar10 >> 0x10 & 0xff] ^ t_im[3][uVar10 >> 0x18];
  cx->ks[0x22] = uVar10;
  uVar12 = uVar11 ^ uVar12;
  uVar10 = cx->ks[0x25] ^ uVar10;
  cx->ks[0x23] = uVar10;
  uVar13 = uVar12 ^ uVar13;
  uVar10 = cx->ks[0x26] ^ uVar10;
  cx->ks[0x1c] = uVar10;
  uVar14 = uVar13 ^ uVar14;
  uVar10 = cx->ks[0x27] ^ uVar10;
  cx->ks[0x1d] = uVar10;
  uVar8 = uVar14 ^ uVar8;
  uVar10 = cx->ks[0x20] ^ uVar10;
  cx->ks[0x1e] = uVar10;
  uVar9 = uVar8 ^ uVar9;
  cx->ks[0x1f] = cx->ks[0x21] ^ uVar10;
  uVar10 = t_fl[0][uVar9 >> 8 & 0xff] ^ t_fl[1][uVar9 >> 0x10 & 0xff] ^ t_fl[2][uVar9 >> 0x18] ^
           t_fl[3][uVar9 & 0xff];
  uVar11 = uVar10 ^ 8 ^ uVar11;
  uVar10 = cx->ks[0x22] ^
           t_im[0][(uVar10 ^ 8) & 0xff] ^ t_im[1][uVar10 >> 8 & 0xff] ^
           t_im[2][uVar10 >> 0x10 & 0xff] ^ t_im[3][uVar10 >> 0x18];
  cx->ks[0x18] = uVar10;
  uVar12 = uVar11 ^ uVar12;
  uVar10 = cx->ks[0x23] ^ uVar10;
  cx->ks[0x19] = uVar10;
  uVar13 = uVar12 ^ uVar13;
  uVar10 = cx->ks[0x1c] ^ uVar10;
  cx->ks[0x1a] = uVar10;
  uVar14 = uVar13 ^ uVar14;
  uVar10 = cx->ks[0x1d] ^ uVar10;
  cx->ks[0x1b] = uVar10;
  uVar8 = uVar14 ^ uVar8;
  uVar10 = cx->ks[0x1e] ^ uVar10;
  cx->ks[0x14] = uVar10;
  uVar9 = uVar8 ^ uVar9;
  cx->ks[0x15] = cx->ks[0x1f] ^ uVar10;
  uVar10 = t_fl[0][uVar9 >> 8 & 0xff] ^ t_fl[1][uVar9 >> 0x10 & 0xff] ^ t_fl[2][uVar9 >> 0x18] ^
           t_fl[3][uVar9 & 0xff];
  uVar11 = uVar10 ^ 0x10 ^ uVar11;
  uVar10 = cx->ks[0x18] ^
           t_im[0][(uVar10 ^ 0x10) & 0xff] ^ t_im[1][uVar10 >> 8 & 0xff] ^
           t_im[2][uVar10 >> 0x10 & 0xff] ^ t_im[3][uVar10 >> 0x18];
  cx->ks[0x16] = uVar10;
  uVar12 = uVar11 ^ uVar12;
  uVar10 = cx->ks[0x19] ^ uVar10;
  cx->ks[0x17] = uVar10;
  uVar13 = uVar12 ^ uVar13;
  uVar10 = cx->ks[0x1a] ^ uVar10;
  cx->ks[0x10] = uVar10;
  uVar14 = uVar13 ^ uVar14;
  uVar10 = cx->ks[0x1b] ^ uVar10;
  cx->ks[0x11] = uVar10;
  uVar8 = uVar14 ^ uVar8;
  uVar10 = cx->ks[0x14] ^ uVar10;
  cx->ks[0x12] = uVar10;
  uVar9 = uVar8 ^ uVar9;
  cx->ks[0x13] = cx->ks[0x15] ^ uVar10;
  uVar10 = t_fl[0][uVar9 >> 8 & 0xff] ^ t_fl[1][uVar9 >> 0x10 & 0xff] ^ t_fl[2][uVar9 >> 0x18] ^
           t_fl[3][uVar9 & 0xff];
  uVar11 = uVar10 ^ 0x20 ^ uVar11;
  uVar10 = cx->ks[0x16] ^
           t_im[0][(uVar10 ^ 0x20) & 0xff] ^ t_im[1][uVar10 >> 8 & 0xff] ^
           t_im[2][uVar10 >> 0x10 & 0xff] ^ t_im[3][uVar10 >> 0x18];
  cx->ks[0xc] = uVar10;
  uVar12 = uVar11 ^ uVar12;
  uVar10 = cx->ks[0x17] ^ uVar10;
  cx->ks[0xd] = uVar10;
  uVar13 = uVar12 ^ uVar13;
  uVar10 = cx->ks[0x10] ^ uVar10;
  cx->ks[0xe] = uVar10;
  uVar14 = uVar13 ^ uVar14;
  uVar10 = cx->ks[0x11] ^ uVar10;
  cx->ks[0xf] = uVar10;
  uVar8 = uVar14 ^ uVar8;
  uVar10 = cx->ks[0x12] ^ uVar10;
  cx->ks[8] = uVar10;
  uVar9 = uVar8 ^ uVar9;
  cx->ks[9] = cx->ks[0x13] ^ uVar10;
  uVar10 = t_fl[0][uVar9 >> 8 & 0xff] ^ t_fl[1][uVar9 >> 0x10 & 0xff] ^ t_fl[2][uVar9 >> 0x18] ^
           t_fl[3][uVar9 & 0xff];
  uVar11 = uVar10 ^ 0x40 ^ uVar11;
  uVar10 = cx->ks[0xc] ^
           t_im[0][(uVar10 ^ 0x40) & 0xff] ^ t_im[1][uVar10 >> 8 & 0xff] ^
           t_im[2][uVar10 >> 0x10 & 0xff] ^ t_im[3][uVar10 >> 0x18];
  cx->ks[10] = uVar10;
  uVar12 = uVar11 ^ uVar12;
  uVar10 = cx->ks[0xd] ^ uVar10;
  cx->ks[0xb] = uVar10;
  uVar13 = uVar12 ^ uVar13;
  uVar10 = cx->ks[0xe] ^ uVar10;
  cx->ks[4] = uVar10;
  uVar14 = uVar13 ^ uVar14;
  uVar10 = cx->ks[0xf] ^ uVar10;
  cx->ks[5] = uVar10;
  uVar10 = cx->ks[8] ^ uVar10;
  cx->ks[6] = uVar10;
  uVar9 = uVar14 ^ uVar8 ^ uVar9;
  cx->ks[7] = cx->ks[9] ^ uVar10;
  uVar11 = t_fl[0][uVar9 >> 8 & 0xff] ^ t_fl[1][uVar9 >> 0x10 & 0xff] ^ t_fl[2][uVar9 >> 0x18] ^
           t_fl[3][uVar9 & 0xff] ^ 0x80 ^ uVar11;
  cx->ks[0] = uVar11;
  uVar11 = uVar11 ^ uVar12;
  cx->ks[1] = uVar11;
  uVar11 = uVar11 ^ uVar13;
  cx->ks[2] = uVar11;
  cx->ks[3] = uVar11 ^ uVar14;
  (cx->inf).l = 0;
  (cx->inf).b[0] = 0xc0;
  return 0;
}

Assistant:

AES_RETURN aes_xi(decrypt_key192)(const unsigned char *key, aes_decrypt_ctx cx[1])
{   uint32_t    ss[7];
#if defined( d_vars )
        d_vars;
#endif

    cx->ks[v(48,(0))] = ss[0] = word_in(key, 0);
    cx->ks[v(48,(1))] = ss[1] = word_in(key, 1);
    cx->ks[v(48,(2))] = ss[2] = word_in(key, 2);
    cx->ks[v(48,(3))] = ss[3] = word_in(key, 3);

#ifdef DEC_KS_UNROLL
    cx->ks[v(48,(4))] = ff(ss[4] = word_in(key, 4));
    cx->ks[v(48,(5))] = ff(ss[5] = word_in(key, 5));
    kdf6(cx->ks, 0); kd6(cx->ks, 1);
    kd6(cx->ks, 2);  kd6(cx->ks, 3);
    kd6(cx->ks, 4);  kd6(cx->ks, 5);
    kd6(cx->ks, 6);  kdl6(cx->ks, 7);
#else
    cx->ks[v(48,(4))] = ss[4] = word_in(key, 4);
    cx->ks[v(48,(5))] = ss[5] = word_in(key, 5);
    {   uint32_t i;

        for(i = 0; i < 7; ++i)
            k6e(cx->ks, i);
        k6ef(cx->ks, 7);
#if !(DEC_ROUND == NO_TABLES)
        for(i = N_COLS; i < 12 * N_COLS; ++i)
            cx->ks[i] = inv_mcol(cx->ks[i]);
#endif
    }
#endif
    cx->inf.l = 0;
    cx->inf.b[0] = 12 * 16;

#ifdef USE_VIA_ACE_IF_PRESENT
    if(VIA_ACE_AVAILABLE)
        cx->inf.b[1] = 0xff;
#endif
    return EXIT_SUCCESS;
}